

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O0

VNode * despot::DESPOT::FindBlocker(VNode *vnode)

{
  double dVar1;
  QNode *pQVar2;
  double dVar3;
  ValuedAction VVar4;
  int local_1c;
  VNode *pVStack_18;
  int count;
  VNode *cur;
  VNode *vnode_local;
  
  local_1c = 1;
  pVStack_18 = vnode;
  while ((pVStack_18 != (VNode *)0x0 &&
         (dVar1 = pVStack_18->utility_upper_bound, dVar3 = -(double)local_1c * DAT_00278a80,
         VVar4 = VNode::default_move(pVStack_18), VVar4.value < dVar3 + dVar1))) {
    local_1c = local_1c + 1;
    pQVar2 = VNode::parent(pVStack_18);
    if (pQVar2 == (QNode *)0x0) {
      pVStack_18 = (VNode *)0x0;
    }
    else {
      pQVar2 = VNode::parent(pVStack_18);
      pVStack_18 = QNode::parent(pQVar2);
    }
  }
  return pVStack_18;
}

Assistant:

VNode* DESPOT::FindBlocker(VNode* vnode) {
	VNode* cur = vnode;
	int count = 1;
	while (cur != NULL) {
		if (cur->utility_upper_bound - count * Globals::config.pruning_constant
			<= cur->default_move().value) {
			break;
		}
		count++;
		if (cur->parent() == NULL) {
			cur = NULL;
		} else {
			cur = cur->parent()->parent();
		}
	}
	return cur;
}